

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::LoopMergeBlock(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  IRContext *this_00;
  uint32_t uVar1;
  mapped_type *ppBVar2;
  Instruction *this_01;
  key_type local_14;
  
  uVar1 = ContainingLoop(this,bb_id);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    ppBVar2 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&((this_00->cfg_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                        .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->id2block_
                   ,&local_14);
    this_01 = BasicBlock::GetMergeInst(*ppBVar2);
    uVar1 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar1 = (uint)this_01->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(this_01,uVar1);
  }
  return uVar1;
}

Assistant:

uint32_t StructuredCFGAnalysis::LoopMergeBlock(uint32_t bb_id) {
  uint32_t header_id = ContainingLoop(bb_id);
  if (header_id == 0) {
    return 0;
  }

  BasicBlock* header = context_->cfg()->block(header_id);
  Instruction* merge_inst = header->GetMergeInst();
  return merge_inst->GetSingleWordInOperand(kMergeNodeIndex);
}